

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O2

void eclmap_rebuild(eclmap_t *emap)

{
  seqmap_t *psVar1;
  char **__base;
  char **ppcVar2;
  size_t __nmemb;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  
  __nmemb = emap->timeline_ins_names->len + emap->ins_names->len;
  free(emap->mnem_set);
  __base = (char **)malloc(__nmemb * 8);
  emap->mnem_set = __base;
  emap->mnem_set_len = __nmemb;
  psVar1 = emap->ins_names;
  sVar3 = psVar1->len;
  lVar4 = sVar3 * 2 + -1;
  ppcVar2 = __base;
  while (bVar6 = sVar3 != 0, sVar3 = sVar3 - 1, bVar6) {
    *ppcVar2 = *(char **)(&psVar1->ptr->key + lVar4 * 2);
    ppcVar2 = ppcVar2 + 1;
    lVar4 = lVar4 + -2;
  }
  psVar1 = emap->timeline_ins_names;
  sVar3 = psVar1->len;
  lVar4 = sVar3 * 2 + -1;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    ppcVar2[sVar5] = *(char **)(&psVar1->ptr->key + lVar4 * 2);
    lVar4 = lVar4 + -2;
  }
  qsort(__base,__nmemb,8,strcmp_indirect);
  return;
}

Assistant:

void
eclmap_rebuild(
    eclmap_t *emap)
{
    char **p;
    size_t count = emap->ins_names->len + emap->timeline_ins_names->len;

    free(emap->mnem_set);
    emap->mnem_set = p = malloc(count * sizeof(char*));
    emap->mnem_set_len = count;

    seqmap_entry_t *ent;
    seqmap_for_each(emap->ins_names, ent)
        *p++ = ent->value;
    seqmap_for_each(emap->timeline_ins_names, ent)
        *p++ = ent->value;

    qsort(emap->mnem_set, emap->mnem_set_len, sizeof(char*), strcmp_indirect);
}